

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

vector<CScript,_std::allocator<CScript>_> * __thiscall
anon_unknown.dwarf_1f0a16::RawDescriptor::MakeScripts
          (RawDescriptor *this,vector<CPubKey,_std::allocator<CPubKey>_> *param_2,
          Span<const_CScript> param_3,FlatSigningProvider *param_4)

{
  vector<CScript,_std::allocator<CScript>_> *in_RDI;
  long in_FS_OFFSET;
  CScript *args;
  
  args = *(CScript **)(in_FS_OFFSET + 0x28);
  Vector<CScript_const&>(args);
  if (*(CScript **)(in_FS_OFFSET + 0x28) == args) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CScript> MakeScripts(const std::vector<CPubKey>&, Span<const CScript>, FlatSigningProvider&) const override { return Vector(m_script); }